

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

Benchmark * __thiscall benchmark::internal::Benchmark::Range(Benchmark *this,int start,int limit)

{
  int iVar1;
  Benchmark *in_RDI;
  int in_stack_00000068;
  int in_stack_0000006c;
  BenchmarkImp *in_stack_00000070;
  BenchmarkImp *in_stack_ffffffffffffffc0;
  CheckHandler *this_00;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  byte bVar2;
  CheckHandler local_18 [3];
  
  iVar1 = BenchmarkImp::ArgsCnt(in_stack_ffffffffffffffc0);
  bVar2 = 0;
  if (iVar1 != -1) {
    iVar1 = BenchmarkImp::ArgsCnt(in_stack_ffffffffffffffc0);
    if (iVar1 != 1) {
      this_00 = local_18;
      CheckHandler::CheckHandler
                ((CheckHandler *)CONCAT17(bVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8
                 ,in_stack_ffffffffffffffd0,(char *)in_RDI,(int)((ulong)this_00 >> 0x20));
      bVar2 = 1;
      CheckHandler::GetLog(this_00);
      goto LAB_00166f45;
    }
  }
  GetNullLogInstance();
LAB_00166f45:
  if ((bVar2 & 1) == 0) {
    BenchmarkImp::Range(in_stack_00000070,in_stack_0000006c,in_stack_00000068);
    return in_RDI;
  }
  CheckHandler::~CheckHandler((CheckHandler *)&LAB_00166f58);
}

Assistant:

Benchmark* Benchmark::Range(int start, int limit) {
  CHECK(imp_->ArgsCnt() == -1 || imp_->ArgsCnt() == 1);
  imp_->Range(start, limit);
  return this;
}